

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

QString * __thiscall
QAccessibleMenuItem::text(QString *__return_storage_ptr__,QAccessibleMenuItem *this,Text t)

{
  Data *pDVar1;
  char cVar2;
  qsizetype qVar3;
  QArrayDataPointer<char16_t> *this_00;
  long in_FS_OFFSET;
  Data *local_78;
  char16_t *pcStack_70;
  QKeySequence key;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (t == Accelerator) {
    _key = &DAT_aaaaaaaaaaaaaaaa;
    QAction::shortcut();
    cVar2 = QKeySequence::isEmpty();
    if (cVar2 == '\0') {
      this_00 = &local_48;
      QKeySequence::toString((SequenceFormat)this_00);
      qVar3 = local_48.size;
      local_78 = local_48.d;
      pcStack_70 = local_48.ptr;
      local_48.d = (Data *)0x0;
      local_48.ptr = (char16_t *)0x0;
      local_48.size = 0;
    }
    else {
      this_00 = &local_60;
      QAction::text();
      qt_accHotKey((QString *)&local_48,(QString *)this_00);
      qVar3 = local_48.size;
      local_78 = local_48.d;
      pcStack_70 = local_48.ptr;
      local_48.d = (Data *)0x0;
      local_48.ptr = (char16_t *)0x0;
      local_48.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
    (__return_storage_ptr__->d).d = local_78;
    (__return_storage_ptr__->d).ptr = pcStack_70;
    (__return_storage_ptr__->d).size = qVar3;
    QKeySequence::~QKeySequence(&key);
  }
  else if (t == Name) {
    QAction::text();
    qt_accStripAmp((QString *)&local_48,(QString *)&local_60);
    pDVar1 = local_48.d;
    local_48.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_48.ptr;
    local_48.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_48.size;
    local_48.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleMenuItem::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Name:
        str = qt_accStripAmp(m_action->text());
        break;
    case QAccessible::Accelerator: {
#ifndef QT_NO_SHORTCUT
        QKeySequence key = m_action->shortcut();
        if (!key.isEmpty()) {
            str = key.toString();
        } else
#endif
        {
            str = qt_accHotKey(m_action->text());
        }
        break;
    }
    default:
        break;
    }
    return str;
}